

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O3

NeuralConsumer * __thiscall
AbstractModuleClient::subscribeNeuralData
          (AbstractModuleClient *this,size_t buffersize,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *channels)

{
  char *pcVar1;
  SubType SVar2;
  network_pimpl *this_00;
  bool bVar3;
  NeuralConsumer *this_01;
  HFParsingInfo parseinfo;
  HighFreqDataType dt;
  undefined1 local_488 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_468;
  int local_450;
  string local_448;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_388;
  undefined1 local_370 [144];
  SubType local_2e0;
  undefined4 uStack_2dc;
  hfs_data_callback_fn p_Stack_2d8;
  void *pvStack_2d0;
  HFParsingInfo local_2c8;
  HighFreqDataType local_288;
  HighFreqDataType local_1f8;
  HighFreqDataType local_168;
  HFSubSockSettings local_d8;
  
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"neurostream","");
  local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"Trodes","");
  bVar3 = MlmWrap::isHfTypeCurrentlySubbed(&this->super_MlmWrap,&local_3c8,&local_3e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
    operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  if (bVar3) {
    local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"neurostream","");
    local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"Trodes","");
    this_01 = (NeuralConsumer *)MlmWrap::getHfSubObject(&this->super_MlmWrap,&local_408,&local_428);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._M_dataplus._M_p != &local_428.field_2) {
      operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != &local_408.field_2) {
      operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    this_00 = (this->super_MlmWrap).state;
    pcVar1 = local_370 + 0x10;
    local_370._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_370,"neurostream","");
    local_488._0_8_ = local_488 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"Trodes","");
    network_pimpl::find_hfdt(&local_288,this_00,(string *)local_370,(string *)local_488);
    if ((undefined1 *)local_488._0_8_ != local_488 + 0x10) {
      operator_delete((void *)local_488._0_8_,local_488._16_8_ + 1);
    }
    if ((char *)local_370._0_8_ != pcVar1) {
      operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
    }
    bVar3 = HighFreqDataType::isValid(&local_288);
    if (bVar3) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_388,channels);
      HighFreqDataType::getDataFormat_abi_cxx11_(&local_3a8,&local_288);
      MlmWrap::createNeuralParsingInfo
                ((HFParsingInfo *)local_488,&this->super_MlmWrap,&local_388,&local_3a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
        operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_388);
      this_01 = (NeuralConsumer *)operator_new(0x420);
      HighFreqDataType::HighFreqDataType(&local_168,&local_288);
      std::vector<int,_std::allocator<int>_>::vector
                (&local_2c8.indices,(vector<int,_std::allocator<int>_> *)local_488);
      local_2c8.sizeOf = local_488._24_8_;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_2c8.dataRequested,&local_468);
      local_2c8.dataLength = local_450;
      NeuralConsumer::NeuralConsumer(this_01,&local_168,(int)buffersize,&local_2c8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_2c8.dataRequested);
      if (local_2c8.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2c8.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2c8.indices.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2c8.indices.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      HighFreqDataType::~HighFreqDataType(&local_168);
      HighFreqDataType::HighFreqDataType(&local_1f8,&local_288);
      SVar2 = (this_01->super_HFSubConsumer).super_HighFreqSub.sockType;
      HighFreqDataType::HighFreqDataType((HighFreqDataType *)local_370,&local_1f8);
      p_Stack_2d8 = (hfs_data_callback_fn)0x0;
      pvStack_2d0 = (void *)0x0;
      local_2e0 = SVar2;
      HighFreqDataType::~HighFreqDataType(&local_1f8);
      MlmWrap::addSubToList(&this->super_MlmWrap,(HighFreqSub *)this_01);
      HighFreqDataType::HighFreqDataType(&local_d8.dataType,(HighFreqDataType *)local_370);
      local_d8.args = pvStack_2d0;
      local_d8._148_4_ = uStack_2dc;
      local_d8.subSockType = local_2e0;
      local_d8.userFoo = p_Stack_2d8;
      MlmWrap::addHfTypeToSubbedList(&this->super_MlmWrap,&local_d8);
      HighFreqDataType::~HighFreqDataType(&local_d8.dataType);
      HighFreqDataType::~HighFreqDataType((HighFreqDataType *)local_370);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_468);
      if ((pointer)local_488._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_488._0_8_,local_488._16_8_ - local_488._0_8_);
      }
    }
    else {
      local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_448,"Neural data could not be found on the network!","");
      MlmWrap::error((string *)local_370,&this->super_MlmWrap,&local_448);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,(char *)local_370._0_8_,local_370._8_8_);
      if ((char *)local_370._0_8_ != pcVar1) {
        operator_delete((void *)local_370._0_8_,local_370._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_448._M_dataplus._M_p != &local_448.field_2) {
        operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
      }
      this_01 = (NeuralConsumer *)0x0;
    }
    HighFreqDataType::~HighFreqDataType(&local_288);
  }
  return this_01;
}

Assistant:

NeuralConsumer* AbstractModuleClient::subscribeNeuralData(size_t buffersize, std::vector<std::string> channels){
    if(isHfTypeCurrentlySubbed(hfType_NEURO, TRODES_NETWORK_ID)){
        return (NeuralConsumer*)getHfSubObject(hfType_NEURO, TRODES_NETWORK_ID);
    }

    HighFreqDataType dt = state->find_hfdt(hfType_NEURO, TRODES_NETWORK_ID);
    if(!dt.isValid()){
        std::cerr << error("Neural data could not be found on the network!");
        return NULL;
    }
    HFParsingInfo parseinfo = createNeuralParsingInfo(channels, dt.getDataFormat());
    NeuralConsumer* newsub = new NeuralConsumer(dt, buffersize, parseinfo);
    HFSubSockSettings sockinfo(dt, newsub->getSubSockType(), NULL, NULL);
    addSubToList(newsub);
    addHfTypeToSubbedList(sockinfo);
    return newsub;
}